

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
UnExemptIRCCommand::trigger
          (UnExemptIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  bool bVar1;
  unsigned_long uVar2;
  vector<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>_>_>
  *this_00;
  size_type sVar3;
  ulong uVar4;
  size_t sVar5;
  char *pcVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  size_t local_d0;
  char *local_c8;
  size_t local_b0;
  char *local_a8;
  size_t local_90;
  char *local_88;
  size_t local_70;
  char *local_68;
  size_t index;
  IRC_Bot *source_local;
  UnExemptIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  pcVar6 = nick._M_str;
  sVar5 = nick._M_len;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&parameters);
  if (bVar1) {
    bVar7 = sv("Error: Too Few Parameters. Syntax: unexempt <Exemption ID>",0x3a);
    local_d0 = bVar7._M_len;
    local_c8 = bVar7._M_str;
    Jupiter::IRC::Client::sendNotice(source,sVar5,pcVar6,local_d0,local_c8);
  }
  else {
    uVar2 = Jupiter::from_string<unsigned_long>(parameters);
    this_00 = (vector<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>_>_>
               *)RenX::ExemptionDatabase::getEntries();
    sVar3 = std::
            vector<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>_>_>
            ::size(this_00);
    if (uVar2 < sVar3) {
      uVar4 = RenX::ExemptionDatabase::deactivate(RenX::exemptionDatabase);
      if ((uVar4 & 1) == 0) {
        bVar7 = sv("Error: Exemption not active.",0x1c);
        local_90 = bVar7._M_len;
        local_88 = bVar7._M_str;
        Jupiter::IRC::Client::sendNotice(source,sVar5,pcVar6,local_90,local_88);
      }
      else {
        bVar7 = sv("Exemption deactivated.",0x16);
        local_70 = bVar7._M_len;
        local_68 = bVar7._M_str;
        Jupiter::IRC::Client::sendNotice(source,sVar5,pcVar6,local_70,local_68);
      }
    }
    else {
      bVar7 = sv("Error: Invalid exemption ID; please find the exemption ID using \"esearch\".",0x4a
                );
      local_b0 = bVar7._M_len;
      local_a8 = bVar7._M_str;
      Jupiter::IRC::Client::sendNotice(source,sVar5,pcVar6,local_b0,local_a8);
    }
  }
  return;
}

Assistant:

void UnExemptIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	if (!parameters.empty())
	{
		size_t index = Jupiter::from_string<size_t>(parameters);
		if (index < RenX::exemptionDatabase->getEntries().size())
		{
			if (RenX::exemptionDatabase->deactivate(index))
				source->sendNotice(nick, "Exemption deactivated."sv);
			else
				source->sendNotice(nick, "Error: Exemption not active."sv);
		}
		else
			source->sendNotice(nick, "Error: Invalid exemption ID; please find the exemption ID using \"esearch\"."sv);
	}
	else source->sendNotice(nick, "Error: Too Few Parameters. Syntax: unexempt <Exemption ID>"sv);
}